

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PassThrough.cpp
# Opt level: O2

void __thiscall PassThrough::handleEvent(PassThrough *this,Event *e)

{
  EventType EVar1;
  
  if (e->type == Spike) {
    this->multiplicity = *(int *)&e[1]._vptr_Event;
    this->weight = *(double *)&e[1].type;
    EVar1 = Spike;
  }
  else {
    EVar1 = No;
  }
  this->eventType = EVar1;
  return;
}

Assistant:

void PassThrough::handleEvent(Event* e) {
    if(e->type == EventType::Spike) {
        eventType = EventType::Spike;
        multiplicity = static_cast<SpikeEvent*>(e)->multiplicity;
        weight = static_cast<SpikeEvent*>(e)->weight;
    }
    else {
        eventType = EventType::No;
    }
}